

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

uint64_t bssl::dtls_aead_sequence(SSL *ssl,DTLSRecordNumber num)

{
  uint16_t uVar1;
  
  if (ssl->s3->version != 0) {
    uVar1 = ssl_protocol_version(ssl);
    if (0x303 < uVar1) {
      num.combined_ = num.combined_ & 0xffffffffffff;
    }
  }
  return num.combined_;
}

Assistant:

static uint64_t dtls_aead_sequence(const SSL *ssl, DTLSRecordNumber num) {
  // DTLS 1.3 uses the sequence number with the AEAD, while DTLS 1.2 uses the
  // combined value. If the version is not known, the epoch is unencrypted and
  // the value is ignored.
  return (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION)
             ? num.sequence()
             : num.combined();
}